

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

int * __thiscall
Memory::AllocateArray<Memory::NoCheckHeapAllocator,int,false>
          (Memory *this,NoCheckHeapAllocator *allocator,
          offset_in_NoCheckHeapAllocator_to_subr AllocFunc,size_t count)

{
  int *piVar1;
  
  if (((ulong)allocator & 1) != 0) {
    allocator = *(NoCheckHeapAllocator **)(allocator + *(long *)(this + AllocFunc) + -1);
  }
  piVar1 = (int *)(*(code *)allocator)
                            (this + AllocFunc,-(ulong)(count >> 0x3e != 0) | count << 2,
                             -(count >> 0x3e));
  return piVar1;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}